

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_missing_complex(void)

{
  bson_json_error_code_t in_EDX;
  
  test_bson_json_error
            ("{ \n      \"foo\" : { \n         \"$options\" : \"ism\"\n      }\n   }",2,in_EDX);
  return;
}

Assistant:

static void
test_bson_json_read_missing_complex (void)
{
   const char *json = "{ \n\
      \"foo\" : { \n\
         \"$options\" : \"ism\"\n\
      }\n\
   }";

   test_bson_json_error (
      json, BSON_ERROR_JSON, BSON_JSON_ERROR_READ_INVALID_PARAM);
}